

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O2

void __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint __line;
  size_t sVar2;
  xr_reader *r_00;
  xr_gamemtlpair *this_00;
  uint32_t id;
  uint32_t uVar3;
  char *__assertion;
  xr_reader *s;
  uint16_t version;
  xr_reader *f;
  xr_gamemtl *material;
  xr_gamemtls_lib *local_40;
  xr_reader *local_38;
  
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0x1000,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x5b;
  }
  else if (version == 1) {
    sVar2 = xr_reader::find_chunk(r,0x1001);
    if (sVar2 != 0) {
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      this->m_material_index = *puVar1;
      puVar1 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      this->m_material_pair_index = *puVar1;
      s = xr_reader::open_chunk(r,0x1002);
      if (s != (xr_reader *)0x0) {
        uVar3 = 0;
        local_40 = this;
        local_38 = r;
        while( true ) {
          r_00 = xr_reader::open_chunk(s,uVar3);
          r = local_38;
          f = r_00;
          if (r_00 == (xr_reader *)0x0) break;
          material = (xr_gamemtl *)operator_new(0x78);
          (material->name)._M_dataplus._M_p = (pointer)&(material->name).field_2;
          (material->name)._M_string_length = 0;
          (material->name).field_2._M_local_buf[0] = '\0';
          (material->desc)._M_dataplus._M_p = (pointer)&(material->desc).field_2;
          (material->desc)._M_string_length = 0;
          (material->desc).field_2._M_local_buf[0] = '\0';
          xr_gamemtl::load(material,r_00);
          std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::push_back
                    (&this->m_materials,&material);
          xr_reader::close_chunk(s,&f);
          uVar3 = uVar3 + 1;
        }
        xr_reader::close_chunk(local_38,&s);
        this = local_40;
      }
      s = xr_reader::open_chunk(r,0x1003);
      if (s != (xr_reader *)0x0) {
        uVar3 = 0;
        while( true ) {
          f = xr_reader::open_chunk(s,uVar3);
          if (f == (xr_reader *)0x0) break;
          this_00 = (xr_gamemtlpair *)operator_new(0xb8);
          xr_gamemtlpair::xr_gamemtlpair(this_00);
          material = (xr_gamemtl *)this_00;
          xr_gamemtlpair::load(this_00,f);
          std::vector<xray_re::xr_gamemtlpair_*,_std::allocator<xray_re::xr_gamemtlpair_*>_>::
          push_back(&this->m_material_pairs,(value_type *)&material);
          xr_reader::close_chunk(s,&f);
          uVar3 = uVar3 + 1;
        }
        xr_reader::close_chunk(r,&s);
      }
      return;
    }
    __assertion = "0";
    __line = 0x5f;
  }
  else {
    __assertion = "version == GAMEMTLS_VERSION";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                ,__line,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
}

Assistant:

void xr_gamemtls_lib::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GAMEMTLS_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GAMEMTLS_VERSION);

	if (!r.find_chunk(GAMEMTLS_CHUNK_AUTOINC))
		xr_not_expected();
	m_material_index = r.r_u32();
	m_material_pair_index = r.r_u32();
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(GAMEMTLS_CHUNK_MATERIALS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtl* material = new xr_gamemtl;
			material->load(*f);
			m_materials.push_back(material);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
	s = r.open_chunk(GAMEMTLS_CHUNK_MATERIAL_PAIRS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtlpair* gamemtlpair = new xr_gamemtlpair;
			gamemtlpair->load(*f);
			m_material_pairs.push_back(gamemtlpair);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
}